

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void clear_datagram_frame_payloads(quicly_conn_t *conn)

{
  anon_struct_168_2_991d24fc_for_datagram_frame_payloads *paVar1;
  size_t i;
  size_t sVar2;
  
  paVar1 = &(conn->egress).datagram_frame_payloads;
  for (sVar2 = 0; sVar2 != (conn->egress).datagram_frame_payloads.count; sVar2 = sVar2 + 1) {
    free(paVar1->payloads[0].base);
    paVar1->payloads[0].base = (uint8_t *)0x0;
    paVar1->payloads[0].len = 0;
    paVar1 = (anon_struct_168_2_991d24fc_for_datagram_frame_payloads *)(paVar1->payloads + 1);
  }
  (conn->egress).datagram_frame_payloads.count = 0;
  return;
}

Assistant:

static void clear_datagram_frame_payloads(quicly_conn_t *conn)
{
    for (size_t i = 0; i != conn->egress.datagram_frame_payloads.count; ++i) {
        free(conn->egress.datagram_frame_payloads.payloads[i].base);
        conn->egress.datagram_frame_payloads.payloads[i] = ptls_iovec_init(NULL, 0);
    }
    conn->egress.datagram_frame_payloads.count = 0;
}